

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O2

string * license::trim_copy(string *__return_storage_ptr__,string *string_to_trim)

{
  int iVar1;
  size_type sVar2;
  char *pcVar3;
  char *pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __tmp;
  char *pcVar5;
  
  pcVar3 = (string_to_trim->_M_dataplus)._M_p;
  sVar2 = string_to_trim->_M_string_length;
  pcVar5 = pcVar3 + sVar2;
  while ((pcVar4 = pcVar5, sVar2 != 0 &&
         (iVar1 = isspace((int)*pcVar3), pcVar4 = pcVar3, iVar1 != 0))) {
    pcVar3 = pcVar3 + 1;
    sVar2 = sVar2 - 1;
  }
  do {
    pcVar3 = pcVar4;
    if (pcVar5 == pcVar4) break;
    iVar1 = isspace((int)pcVar5[-1]);
    pcVar3 = pcVar5;
    pcVar5 = pcVar5 + -1;
  } while (iVar1 != 0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

string trim_copy(const string& string_to_trim) {
	std::string::const_iterator it = string_to_trim.begin();
	while (it != string_to_trim.end() && isspace(*it))
		it++;

	std::string::const_reverse_iterator rit = string_to_trim.rbegin();
	while (rit.base() != it && isspace(*rit))
		rit++;

	return std::string(it, rit.base());
}